

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockpacking.h
# Opt level: O3

uint32_t * __thiscall
FastPForLib::FastBinaryPacking<8U>::decodeArray
          (FastBinaryPacking<8U> *this,uint32_t *in,size_t param_2,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  uint uVar2;
  uint32_t *in_00;
  uint32_t i;
  long lVar3;
  uint32_t *puVar4;
  uint32_t *out_00;
  undefined1 auVar5 [16];
  uint local_48;
  undefined8 local_44;
  uint local_3c;
  
  uVar1 = *in;
  in_00 = in + 1;
  puVar4 = out;
  if ((ulong)uVar1 != 0) {
    do {
      lVar3 = 0;
      auVar5 = vpbroadcastd_avx512vl();
      auVar5 = vpsrlvd_avx2(auVar5,_DAT_00194590);
      auVar5 = vpand_avx(auVar5,_DAT_001945a0);
      local_48 = *in_00 >> 0x18;
      local_44 = auVar5._0_8_;
      uVar2 = *in_00;
      in_00 = in_00 + 1;
      local_3c = (uint)(byte)uVar2;
      out_00 = puVar4;
      do {
        in_00 = fastunpack_8(in_00,out_00,(&local_48)[lVar3]);
        lVar3 = lVar3 + 1;
        out_00 = out_00 + 8;
      } while (lVar3 != 4);
      puVar4 = puVar4 + 0x20;
    } while (puVar4 < out + uVar1);
  }
  *nvalue = (long)puVar4 - (long)out >> 2;
  return in_00;
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t /*length*/,
                              uint32_t *out, size_t &nvalue) override {
    const uint32_t actuallength = *in++;
    const uint32_t *const initout(out);
    uint32_t Bs[HowManyMiniBlocks];
    for (; out < initout + actuallength; out += BlockSize) {
      Bs[0] = static_cast<uint8_t>(in[0] >> 24);
      Bs[1] = static_cast<uint8_t>(in[0] >> 16);
      Bs[2] = static_cast<uint8_t>(in[0] >> 8);
      Bs[3] = static_cast<uint8_t>(in[0]);
      ++in;
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i) {
        if (MiniBlockSize == 8)
          in = fastunpack_8(in, out + i * MiniBlockSize, Bs[i]);
        else if (MiniBlockSize == 16)
          in = fastunpack_16(in, out + i * MiniBlockSize, Bs[i]);
        else if (MiniBlockSize == 24)
          in = fastunpack_24(in, out + i * MiniBlockSize, Bs[i]);
        else if (MiniBlockSize == 32) {
          fastunpack(in, out + i * MiniBlockSize, Bs[i]);
          in += Bs[i];
        } else
          throw std::logic_error("unsupported MiniBlockSize");
      }
    }
    nvalue = out - initout;
    return in;
  }